

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindAggregateState
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalType *this_00;
  pointer pLVar1;
  bool bVar2;
  reference pvVar3;
  pointer pEVar4;
  pointer pEVar5;
  aggregate_state_t *paVar6;
  Catalog *this_01;
  AggregateFunctionCatalogEntry *pAVar7;
  idx_t offset;
  InternalException *pIVar8;
  BinderException *pBVar9;
  LogicalType *arg_type;
  pointer pLVar10;
  pointer *__ptr;
  element_type *other;
  undefined1 local_3c8 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_3c0;
  element_type *local_3b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  args;
  optional_idx best_function;
  aggregate_state_t state_type;
  Value local_328;
  FunctionBinder function_binder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string local_238;
  string local_218;
  LogicalType local_1f8;
  AggregateFunction bound_aggr;
  ErrorData error;
  
  local_3b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)context;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  local_3b8 = (element_type *)&pEVar4->return_type;
  pLVar1 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pLVar10 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start; pLVar10 != pLVar1; pLVar10 = pLVar10 + 1)
  {
    LogicalType::operator=(pLVar10,(LogicalType *)local_3b8);
  }
  if (*(LogicalTypeId *)
       &(local_3b8->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal.
        super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      AGGREGATE_STATE) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&bound_aggr,"Can only FINALIZE aggregate state, not %s",(allocator *)&error
              );
    LogicalType::ToString_abi_cxx11_(&local_218,(LogicalType *)local_3b8);
    BinderException::BinderException<std::__cxx11::string>(pBVar9,(string *)&bound_aggr,&local_218);
    __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x10) {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,1);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    bVar2 = LogicalType::operator!=(&pEVar4->return_type,&pEVar5->return_type);
    if (bVar2) {
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,1);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar3);
      if ((pEVar4->return_type).id_ != BLOB) {
        pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&bound_aggr,
                   "Cannot COMBINE aggregate states from different functions, %s <> %s",
                   (allocator *)&error);
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,0);
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar3);
        LogicalType::ToString_abi_cxx11_(&local_238,&pEVar4->return_type);
        pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,1);
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar3);
        LogicalType::ToString_abi_cxx11_(&local_258,&pEVar4->return_type);
        BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                  (pBVar9,(string *)&bound_aggr,&local_238,&local_258);
        __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  paVar6 = AggregateStateType::GetStateType((LogicalType *)local_3b8);
  aggregate_state_t::aggregate_state_t(&state_type,paVar6);
  this_01 = Catalog::GetSystemCatalog((ClientContext *)local_3b0._M_pi);
  ::std::__cxx11::string::string((string *)&bound_aggr,"main",(allocator *)&error);
  pAVar7 = Catalog::GetEntry<duckdb::AggregateFunctionCatalogEntry>
                     (this_01,(ClientContext *)local_3b0._M_pi,(string *)&bound_aggr,
                      &state_type.function_name,(QueryErrorContext)0xffffffffffffffff);
  ::std::__cxx11::string::~string((string *)&bound_aggr);
  if ((pAVar7->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.type
      == AGGREGATE_FUNCTION_ENTRY) {
    ErrorData::ErrorData(&error);
    FunctionBinder::FunctionBinder(&function_binder,(ClientContext *)local_3b0._M_pi);
    best_function =
         FunctionBinder::BindFunction
                   (&function_binder,
                    &(pAVar7->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                     super_CatalogEntry.name,&pAVar7->functions,&state_type.bound_argument_types,
                    &error);
    if (best_function.index == 0xffffffffffffffff) {
      pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&bound_aggr,"Could not re-bind exported aggregate %s: %s",
                 (allocator *)&local_328);
      ::std::__cxx11::string::string((string *)&local_298,(string *)&state_type);
      ::std::__cxx11::string::string((string *)&local_2b8,(string *)&error.final_message);
      InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                (pIVar8,(string *)&bound_aggr,&local_298,&local_2b8);
      __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    offset = optional_idx::GetIndex(&best_function);
    FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
              (&bound_aggr,&(pAVar7->functions).super_FunctionSet<duckdb::AggregateFunction>,offset)
    ;
    if (bound_aggr.bind != (bind_aggregate_function_t)0x0) {
      args.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      args.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      args.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::reserve((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&args,((long)state_type.bound_argument_types.
                                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                .
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)state_type.bound_argument_types.
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               .
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      for (pLVar10 = state_type.bound_argument_types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pLVar10 !=
          state_type.bound_argument_types.
          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish; pLVar10 = pLVar10 + 1) {
        LogicalType::LogicalType(&local_1f8,pLVar10);
        Value::Value(&local_328,&local_1f8);
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_3c0,&local_328);
        local_3c8 = (undefined1  [8])local_3c0._M_pi;
        local_3c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&args,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)local_3c8);
        if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
            local_3c8 != (Expression *)0x0) {
          (**(code **)(*(long *)local_3c8 + 8))();
        }
        local_3c8 = (undefined1  [8])0x0;
        if (local_3c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          (*(local_3c0._M_pi)->_vptr__Sp_counted_base[1])();
        }
        local_3c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Value::~Value(&local_328);
        LogicalType::~LogicalType(&local_1f8);
      }
      (*bound_aggr.bind)((ClientContext *)local_3c8,(AggregateFunction *)local_3b0._M_pi,
                         (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)&bound_aggr);
      if (local_3c8 != (undefined1  [8])0x0) {
        pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_328,
                   "Aggregate function with bind info not supported yet in aggregate state export",
                   (allocator *)&local_3c0);
        BinderException::BinderException(pBVar9,(string *)&local_328);
        __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&args);
    }
    this_00 = &bound_aggr.super_BaseScalarFunction.return_type;
    bVar2 = LogicalType::operator!=(this_00,&state_type.return_type);
    if (!bVar2) {
      bVar2 = ::std::operator!=(&bound_aggr.super_BaseScalarFunction.super_SimpleFunction.arguments.
                                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ,&state_type.bound_argument_types.
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               );
      if (!bVar2) {
        bVar2 = ::std::operator==(&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                                   super_Function.name,"finalize");
        other = local_3b8;
        if (bVar2) {
          other = (element_type *)this_00;
        }
        LogicalType::operator=
                  (&(bound_function->super_BaseScalarFunction).return_type,(LogicalType *)other);
        args.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)(*bound_aggr.state_size)(&bound_aggr);
        make_uniq<duckdb::ExportAggregateBindData,duckdb::AggregateFunction&,unsigned_long>
                  ((duckdb *)&local_328,&bound_aggr,(unsigned_long *)&args);
        *(undefined8 *)this = local_328.type_._0_8_;
        AggregateFunction::~AggregateFunction(&bound_aggr);
        ErrorData::~ErrorData(&error);
        aggregate_state_t::~aggregate_state_t(&state_type);
        return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
               (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
      }
    }
    pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_328,"Type mismatch for exported aggregate %s",(allocator *)&args);
    ::std::__cxx11::string::string((string *)&local_2d8,(string *)&state_type);
    InternalException::InternalException<std::__cxx11::string>
              (pIVar8,(string *)&local_328,&local_2d8);
    __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&bound_aggr,"Could not find aggregate %s",(allocator *)&error);
  ::std::__cxx11::string::string((string *)&local_278,(string *)&state_type);
  InternalException::InternalException<std::__cxx11::string>
            (pIVar8,(string *)&bound_aggr,&local_278);
  __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> BindAggregateState(ClientContext &context, ScalarFunction &bound_function,
                                                   vector<unique_ptr<Expression>> &arguments) {

	// grab the aggregate type and bind the aggregate again

	// the aggregate name and types are in the logical type of the aggregate state, make sure its sane
	auto &arg_return_type = arguments[0]->return_type;
	for (auto &arg_type : bound_function.arguments) {
		arg_type = arg_return_type;
	}

	if (arg_return_type.id() != LogicalTypeId::AGGREGATE_STATE) {
		throw BinderException("Can only FINALIZE aggregate state, not %s", arg_return_type.ToString());
	}
	// combine
	if (arguments.size() == 2 && arguments[0]->return_type != arguments[1]->return_type &&
	    arguments[1]->return_type.id() != LogicalTypeId::BLOB) {
		throw BinderException("Cannot COMBINE aggregate states from different functions, %s <> %s",
		                      arguments[0]->return_type.ToString(), arguments[1]->return_type.ToString());
	}

	// following error states are only reachable when someone messes up creating the state_type
	// which is impossible from SQL

	auto state_type = AggregateStateType::GetStateType(arg_return_type);

	// now we can look up the function in the catalog again and bind it
	auto &func = Catalog::GetSystemCatalog(context).GetEntry<AggregateFunctionCatalogEntry>(context, DEFAULT_SCHEMA,
	                                                                                        state_type.function_name);
	if (func.type != CatalogType::AGGREGATE_FUNCTION_ENTRY) {
		throw InternalException("Could not find aggregate %s", state_type.function_name);
	}
	auto &aggr = func.Cast<AggregateFunctionCatalogEntry>();

	ErrorData error;

	FunctionBinder function_binder(context);
	auto best_function =
	    function_binder.BindFunction(aggr.name, aggr.functions, state_type.bound_argument_types, error);
	if (!best_function.IsValid()) {
		throw InternalException("Could not re-bind exported aggregate %s: %s", state_type.function_name,
		                        error.Message());
	}
	auto bound_aggr = aggr.functions.GetFunctionByOffset(best_function.GetIndex());
	if (bound_aggr.bind) {
		// FIXME: this is really hacky
		// but the aggregate state export needs a rework around how it handles more complex aggregates anyway
		vector<unique_ptr<Expression>> args;
		args.reserve(state_type.bound_argument_types.size());
		for (auto &arg_type : state_type.bound_argument_types) {
			args.push_back(make_uniq<BoundConstantExpression>(Value(arg_type)));
		}
		auto bind_info = bound_aggr.bind(context, bound_aggr, args);
		if (bind_info) {
			throw BinderException("Aggregate function with bind info not supported yet in aggregate state export");
		}
	}

	if (bound_aggr.return_type != state_type.return_type || bound_aggr.arguments != state_type.bound_argument_types) {
		throw InternalException("Type mismatch for exported aggregate %s", state_type.function_name);
	}

	if (bound_function.name == "finalize") {
		bound_function.return_type = bound_aggr.return_type;
	} else {
		D_ASSERT(bound_function.name == "combine");
		bound_function.return_type = arg_return_type;
	}

	return make_uniq<ExportAggregateBindData>(bound_aggr, bound_aggr.state_size(bound_aggr));
}